

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O1

double ddot(int n,double *dx,int incx,double *dy,int incy)

{
  ulong uVar1;
  double *pdVar2;
  uint uVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  
  if (n < 1) {
    return 0.0;
  }
  if (incy == 1 && incx == 1) {
    uVar1 = (ulong)(uint)n;
    uVar3 = (uint)n % 5;
    if (uVar3 == 0) {
      dVar7 = 0.0;
    }
    else {
      dVar7 = 0.0;
      uVar6 = 0;
      do {
        dVar7 = dVar7 + dx[uVar6] * dy[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    if ((int)uVar3 < n) {
      uVar6 = uVar1 / 5;
      lVar5 = 0;
      do {
        dVar7 = dx[uVar6 * -5 + uVar1 + lVar5 + 4] * dy[uVar6 * -5 + uVar1 + lVar5 + 4] +
                dx[uVar6 * -5 + uVar1 + lVar5 + 3] * dy[uVar6 * -5 + uVar1 + lVar5 + 3] +
                dx[uVar6 * -5 + uVar1 + lVar5 + 2] * dy[uVar6 * -5 + uVar1 + lVar5 + 2] +
                dx[uVar6 * -5 + uVar1 + lVar5 + 1] * dy[uVar6 * -5 + uVar1 + lVar5 + 1] +
                dx[uVar6 * -5 + uVar1 + lVar5] * dy[uVar6 * -5 + uVar1 + lVar5] + dVar7;
        lVar5 = lVar5 + 5;
      } while (n + (int)uVar6 * -5 + (int)lVar5 < n);
    }
    return dVar7;
  }
  pdVar4 = dx + (incx >> 0x1f & (1 - n) * incx);
  pdVar2 = dy + (incy >> 0x1f & (1 - n) * incy);
  dVar7 = 0.0;
  do {
    dVar7 = dVar7 + *pdVar4 * *pdVar2;
    pdVar4 = pdVar4 + incx;
    pdVar2 = pdVar2 + incy;
    n = n + -1;
  } while (n != 0);
  return dVar7;
}

Assistant:

double ddot ( int n, double dx[], int incx, double dy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DDOT forms the dot product of two vectors.
//
//  Discussion:
//
//    This routine uses unrolled loops for increments equal to one.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input, double DX[*], the first vector.
//
//    Input, int INCX, the increment between successive entries in DX.
//
//    Input, double DY[*], the second vector.
//
//    Input, int INCY, the increment between successive entries in DY.
//
//    Output, double DDOT, the sum of the product of the corresponding
//    entries of DX and DY.
//
{
  double dtemp;
  int i;
  int ix;
  int iy;
  int m;

  dtemp = 0.0;

  if ( n <= 0 )
  {
    return dtemp;
  }
//
//  Code for unequal increments or equal increments
//  not equal to 1.
//
  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      dtemp = dtemp + dx[ix] * dy[iy];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
//
//  Code for both increments equal to 1.
//
  else
  {
    m = n % 5;

    for ( i = 0; i < m; i++ )
    {
      dtemp = dtemp + dx[i] * dy[i];
    }

    for ( i = m; i < n; i = i + 5 )
    {
      dtemp = dtemp + dx[i  ] * dy[i  ]
                    + dx[i+1] * dy[i+1]
                    + dx[i+2] * dy[i+2]
                    + dx[i+3] * dy[i+3]
                    + dx[i+4] * dy[i+4];
    }

  }

  return dtemp;
}